

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O1

int rtosc_arg_val_null(rtosc_arg_val_t *av,char type)

{
  int iVar1;
  int iVar2;
  undefined7 in_register_00000031;
  
  av->type = type;
  iVar1 = 0;
  iVar2 = (int)CONCAT71(in_register_00000031,type);
  if (iVar2 < 99) {
    if (iVar2 != 0x46) {
      if (iVar2 == 0x53) goto switchD_00102f6c_caseD_64;
      if (iVar2 != 0x54) {
        return 0;
      }
    }
    av->type = 'F';
    (av->val).T = '\0';
  }
  else {
    switch(iVar2) {
    case 99:
    case 0x66:
    case 0x69:
    case 0x72:
      (av->val).i = 0;
      break;
    case 100:
    case 0x68:
    case 0x73:
    case 0x74:
switchD_00102f6c_caseD_64:
      (av->val).d = 0.0;
      break;
    default:
      goto switchD_00102f6c_caseD_65;
    }
  }
  iVar1 = 1;
switchD_00102f6c_caseD_65:
  return iVar1;
}

Assistant:

int rtosc_arg_val_null(rtosc_arg_val_t* av, char type)
{
    av->type = type;
    switch(type)
    {
        case 'h': av->val.h = 0; return true;
        case 't': av->val.t = 0; return true;
        case 's':
        case 'S': av->val.s = NULL; return true;
        case 'd': av->val.d = 0.0; return true;
        case 'f': av->val.f = 0.0f; return true;
        case 'c':
        case 'i':
        case 'r': av->val.i = 0; return true;
        case 'T':
        case 'F': av->type = 'F'; av->val.T = 0; return true;
        default: return false;
    }
}